

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall
gui::DialogBox::handleMousePress(DialogBox *this,Button button,Vector2f *mouseParent)

{
  element_type *peVar1;
  Vector2f *pVVar2;
  Vector2<float> *in_RDX;
  int in_ESI;
  Widget *in_RDI;
  float fVar3;
  Vector2f VVar4;
  Vector2f mouseLocal;
  undefined4 in_stack_ffffffffffffffc0;
  float fVar5;
  undefined4 in_stack_ffffffffffffffc4;
  float fVar6;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  Button in_stack_ffffffffffffffdc;
  Group *in_stack_ffffffffffffffe0;
  
  Group::handleMousePress
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             (Vector2f *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  VVar4 = Widget::toLocalOriginSpace
                    (in_RDI,(Vector2f *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if ((in_ESI == 0) &&
     ((*(byte *)((long)&in_RDI[1].onMouseEnter.callbacks_._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_left + 4) & 1) != 0)) {
    fVar5 = VVar4.y;
    peVar1 = std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24e42d);
    fVar6 = peVar1->titleBarHeight_;
    peVar1 = std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24e44c);
    fVar3 = sf::Shape::getOutlineThickness(&(peVar1->rect_).super_Shape);
    if (fVar5 <= fVar6 - fVar3) {
      std::pair<sf::Vector2<float>,_bool>::pair<bool,_true>
                ((pair<sf::Vector2<float>,_bool> *)&stack0xffffffffffffffd4,in_RDX,
                 (bool *)&stack0xffffffffffffffd3);
      std::pair<sf::Vector2<float>,_bool>::operator=
                ((pair<sf::Vector2<float>,_bool> *)
                 &in_RDI[1].onMouseEnter.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_right,(type)&stack0xffffffffffffffd4);
      pVVar2 = Widget::getPosition((Widget *)0x24e4ad);
      *(Vector2f *)
       ((long)&in_RDI[1].onMouseEnter.callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count +
       4) = *pVVar2;
    }
  }
  return;
}

Assistant:

void DialogBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left && draggable_ && mouseLocal.y <= style_->titleBarHeight_ - style_->rect_.getOutlineThickness()) {
        dragPoint_ = {mouseParent, true};
        initialPosition_ = getPosition();
    }
}